

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::RenderDragDropTargetRect(ImRect *bb,ImRect *item_clip_rect)

{
  bool bVar1;
  byte bVar2;
  ImVec2 *in_RDI;
  bool push_clip_rect;
  ImRect bb_display;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImDrawList *this;
  ImRect *in_stack_ffffffffffffffb8;
  ImDrawList *in_stack_ffffffffffffffc0;
  ImRect local_30;
  ImGuiWindow *local_20;
  ImGuiContext *local_18;
  
  local_18 = GImGui;
  local_20 = GImGui->CurrentWindow;
  local_30.Min = *in_RDI;
  local_30.Max = in_RDI[1];
  ImRect::ClipWith((ImRect *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  ImRect::Expand(&local_30,3.5);
  bVar1 = ImRect::Contains(&local_20->ClipRect,&local_30);
  bVar2 = (bVar1 ^ 0xffU) & 1;
  if (bVar2 != 0) {
    ImDrawList::PushClipRectFullScreen(in_stack_ffffffffffffffc0);
  }
  this = local_20->DrawList;
  GetColorU32((ImGuiCol)((ulong)&local_30.Max >> 0x20),SUB84(&local_30.Max,0));
  ImDrawList::AddRect((ImDrawList *)bb,&item_clip_rect->Min,(ImVec2 *)g,window._4_4_,window._0_4_,
                      (ImDrawFlags)bb_display.Max.y,bb_display.Max.x);
  if (bVar2 != 0) {
    ImDrawList::PopClipRect(this);
  }
  return;
}

Assistant:

void ImGui::RenderDragDropTargetRect(const ImRect& bb, const ImRect& item_clip_rect)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImRect bb_display = bb;
    bb_display.ClipWith(item_clip_rect); // Clip THEN expand so we have a way to visualize that target is not entirely visible.
    bb_display.Expand(3.5f);
    bool push_clip_rect = !window->ClipRect.Contains(bb_display);
    if (push_clip_rect)
        window->DrawList->PushClipRectFullScreen();
    window->DrawList->AddRect(bb_display.Min, bb_display.Max, GetColorU32(ImGuiCol_DragDropTarget), 0.0f, 0, 2.0f);
    if (push_clip_rect)
        window->DrawList->PopClipRect();
}